

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void xmlParserPrintFileContextInternal
               (xmlParserInputPtr input,xmlGenericErrorFunc channel,void *data)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte *utf;
  byte *__src;
  long lVar4;
  xmlChar content [81];
  int local_88 [22];
  
  if ((input == (xmlParserInputPtr)0x0) || (pbVar1 = input->cur, pbVar1 == (byte *)0x0)) {
    return;
  }
  for (__src = pbVar1; (input->base < __src && ((*__src == 0xd || (*__src == 10))));
      __src = __src + -1) {
  }
  uVar3 = 0;
  for (; (((uVar3 < 0x50 && (input->base < __src)) && (*__src != 10)) && (*__src != 0xd));
      __src = __src + -1) {
    uVar3 = uVar3 + 1;
  }
  if ((uVar3 != 0) && ((*__src == 0xd || (*__src == 10)))) {
    __src = __src + 1;
  }
  utf = __src;
  uVar3 = 0;
  while ((0xd < *utf || ((0x2401U >> (*utf & 0x1f) & 1) == 0))) {
    local_88[0] = *(int *)&input->end - (int)utf;
    iVar2 = xmlGetUTF8Char(utf,local_88);
    if (iVar2 < 0) break;
    if (0x50 < local_88[0] + uVar3) break;
    utf = utf + local_88[0];
    uVar3 = local_88[0] + uVar3;
  }
  memcpy(local_88,__src,(ulong)uVar3);
  *(undefined1 *)((long)local_88 + (ulong)uVar3) = 0;
  lVar4 = 0;
  (*channel)(data,"%s\n",local_88);
  do {
    if (((int)pbVar1 - (int)__src == (int)lVar4) || ((int)lVar4 == 0x4f)) goto LAB_0012f07c;
    if (*(char *)((long)local_88 + lVar4) != '\t') {
      if (*(char *)((long)local_88 + lVar4) == '\0') {
LAB_0012f07c:
        *(undefined2 *)((long)local_88 + lVar4) = 0x5e;
        (*channel)(data,"%s\n",local_88);
        return;
      }
      *(undefined1 *)((long)local_88 + lVar4) = 0x20;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static void
xmlParserPrintFileContextInternal(xmlParserInputPtr input ,
		xmlGenericErrorFunc channel, void *data ) {
    const xmlChar *cur, *base, *start;
    unsigned int n, col;	/* GCC warns if signed, because compared with sizeof() */
    xmlChar  content[81]; /* space for 80 chars + line terminator */
    xmlChar *ctnt;

    if ((input == NULL) || (input->cur == NULL))
        return;

    cur = input->cur;
    base = input->base;
    /* skip backwards over any end-of-lines */
    while ((cur > base) && ((*(cur) == '\n') || (*(cur) == '\r'))) {
	cur--;
    }
    n = 0;
    /* search backwards for beginning-of-line (to max buff size) */
    while ((n < sizeof(content) - 1) && (cur > base) &&
	   (*cur != '\n') && (*cur != '\r')) {
        cur--;
        n++;
    }
    if ((n > 0) && ((*cur == '\n') || (*cur == '\r'))) {
        cur++;
    } else {
        /* skip over continuation bytes */
        while ((cur < input->cur) && ((*cur & 0xC0) == 0x80))
            cur++;
    }
    /* calculate the error position in terms of the current position */
    col = input->cur - cur;
    /* search forward for end-of-line (to max buff size) */
    n = 0;
    start = cur;
    /* copy selected text to our buffer */
    while ((*cur != 0) && (*(cur) != '\n') && (*(cur) != '\r')) {
        int len = input->end - cur;
        int c = xmlGetUTF8Char(cur, &len);

        if ((c < 0) || (n + len > sizeof(content)-1))
            break;
        cur += len;
	n += len;
    }
    memcpy(content, start, n);
    content[n] = 0;
    /* print out the selected text */
    channel(data ,"%s\n", content);
    /* create blank line with problem pointer */
    n = 0;
    ctnt = content;
    /* (leave buffer space for pointer + line terminator) */
    while ((n<col) && (n++ < sizeof(content)-2) && (*ctnt != 0)) {
	if (*(ctnt) != '\t')
	    *(ctnt) = ' ';
	ctnt++;
    }
    *ctnt++ = '^';
    *ctnt = 0;
    channel(data ,"%s\n", content);
}